

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxv_basic.cpp
# Opt level: O2

void mxv(Type (*result) [1500],Type (*mx) [1500] [6000],Type (*v) [6000])

{
  int i;
  long lVar1;
  int j;
  long lVar2;
  double dVar3;
  
  for (lVar1 = 0; lVar1 != 0x5dc; lVar1 = lVar1 + 1) {
    (*result)[lVar1] = 0.0;
    dVar3 = 0.0;
    for (lVar2 = 0; lVar2 != 6000; lVar2 = lVar2 + 1) {
      dVar3 = dVar3 + (*(Type (*) [6000])(*mx)[0])[lVar2] * (*v)[lVar2];
      (*result)[lVar1] = dVar3;
    }
    mx = (Type (*) [1500] [6000])((long)mx + 48000);
  }
  return;
}

Assistant:

void mxv(Type (& result)[BCK], const Type (& mx)[BCK][N], const Type (&v) [N])
{  
  for(int i = 0; i < BCK; i++) {
    result[i] = (Type)0;
    for(int j = 0; j < N; j++)
      result[i] += mx[i][j] * v[j];
  }
}